

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SyncMethod(sqlite3_vtab *pVtab)

{
  int iVar1;
  int local_34;
  int A;
  int mxLevel;
  i64 iLastRowid;
  Fts3Table *pFStack_20;
  int rc;
  Fts3Table *p;
  sqlite3_vtab *psStack_10;
  u32 nMinMerge;
  sqlite3_vtab *pVtab_local;
  
  p._4_4_ = 0x40;
  pFStack_20 = (Fts3Table *)pVtab;
  psStack_10 = pVtab;
  _A = sqlite3_last_insert_rowid((sqlite3 *)pVtab[1].pModule);
  iLastRowid._4_4_ = sqlite3Fts3PendingTermsFlush(pFStack_20);
  if ((((iLastRowid._4_4_ == 0) && (4 < pFStack_20->nLeafAdd)) && (pFStack_20->nAutoincrmerge != 0))
     && (pFStack_20->nAutoincrmerge != 0xff)) {
    local_34 = 0;
    iLastRowid._4_4_ = sqlite3Fts3MaxLevel(pFStack_20,&local_34);
    iVar1 = pFStack_20->nLeafAdd * local_34;
    iVar1 = iVar1 / 2 + iVar1;
    if (0x40 < iVar1) {
      iLastRowid._4_4_ = sqlite3Fts3Incrmerge(pFStack_20,iVar1,pFStack_20->nAutoincrmerge);
    }
  }
  sqlite3Fts3SegmentsClose(pFStack_20);
  sqlite3_set_last_insert_rowid(pFStack_20->db,_A);
  return iLastRowid._4_4_;
}

Assistant:

static int fts3SyncMethod(sqlite3_vtab *pVtab){

  /* Following an incremental-merge operation, assuming that the input
  ** segments are not completely consumed (the usual case), they are updated
  ** in place to remove the entries that have already been merged. This
  ** involves updating the leaf block that contains the smallest unmerged
  ** entry and each block (if any) between the leaf and the root node. So
  ** if the height of the input segment b-trees is N, and input segments
  ** are merged eight at a time, updating the input segments at the end
  ** of an incremental-merge requires writing (8*(1+N)) blocks. N is usually
  ** small - often between 0 and 2. So the overhead of the incremental
  ** merge is somewhere between 8 and 24 blocks. To avoid this overhead
  ** dwarfing the actual productive work accomplished, the incremental merge
  ** is only attempted if it will write at least 64 leaf blocks. Hence
  ** nMinMerge.
  **
  ** Of course, updating the input segments also involves deleting a bunch
  ** of blocks from the segments table. But this is not considered overhead
  ** as it would also be required by a crisis-merge that used the same input 
  ** segments.
  */
  const u32 nMinMerge = 64;       /* Minimum amount of incr-merge work to do */

  Fts3Table *p = (Fts3Table*)pVtab;
  int rc;
  i64 iLastRowid = sqlite3_last_insert_rowid(p->db);

  rc = sqlite3Fts3PendingTermsFlush(p);
  if( rc==SQLITE_OK 
   && p->nLeafAdd>(nMinMerge/16) 
   && p->nAutoincrmerge && p->nAutoincrmerge!=0xff
  ){
    int mxLevel = 0;              /* Maximum relative level value in db */
    int A;                        /* Incr-merge parameter A */

    rc = sqlite3Fts3MaxLevel(p, &mxLevel);
    assert( rc==SQLITE_OK || mxLevel==0 );
    A = p->nLeafAdd * mxLevel;
    A += (A/2);
    if( A>(int)nMinMerge ) rc = sqlite3Fts3Incrmerge(p, A, p->nAutoincrmerge);
  }
  sqlite3Fts3SegmentsClose(p);
  sqlite3_set_last_insert_rowid(p->db, iLastRowid);
  return rc;
}